

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::print
          (tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *this,QDomDocument *doc,
          QDomElement *parent)

{
  undefined8 *puVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *ptVar5;
  QDomDocument *pQVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QChar QVar10;
  pointer pQVar11;
  QDomNode *this_00;
  undefined8 *puVar12;
  QDomElement this_element;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *local_88;
  QDomDocument *local_80;
  pointer local_78;
  QDomNode local_70 [8];
  QDomNode local_68 [8];
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  bVar7 = tag_t<cfgfile::qstring_trait_t>::is_defined(&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (bVar7) {
    local_e8.d = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.d;
    local_e8.ptr = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.ptr;
    local_e8.size = (this->super_tag_t<cfgfile::qstring_trait_t>).m_name.m_str.d.size;
    if (local_e8.d != (Data *)0x0) {
      LOCK();
      ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QDomDocument::createElement((QString *)&this_element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    local_80 = doc;
    if (parent == (QDomElement *)0x0) {
      this_00 = local_68;
      QDomNode::appendChild(this_00);
    }
    else {
      this_00 = local_70;
      QDomNode::appendChild(this_00);
    }
    QDomNode::~QDomNode(this_00);
    local_78 = (this->m_values).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
               super__Vector_impl_data._M_finish;
    iVar9 = 1;
    local_88 = this;
    for (pQVar11 = (this->m_values).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                   super__Vector_impl_data._M_start; ptVar5 = local_88, pQVar11 != local_78;
        pQVar11 = pQVar11 + 1) {
      local_e8.d = (pQVar11->d).d;
      local_e8.ptr = (pQVar11->d).ptr;
      local_e8.size = (pQVar11->d).size;
      if (local_e8.d != (Data *)0x0) {
        LOCK();
        ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      to_cfgfile_format<cfgfile::qstring_trait_t>((string_t *)&local_c8,(string_t *)&local_e8);
      qVar4 = local_e8.size;
      pcVar3 = local_e8.ptr;
      pDVar2 = local_e8.d;
      local_e8.d = local_c8.d;
      local_e8.ptr = local_c8.ptr;
      local_c8.d = pDVar2;
      local_c8.ptr = pcVar3;
      local_e8.size = local_c8.size;
      local_c8.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      local_c8.d = local_e8.d;
      local_c8.ptr = local_e8.ptr;
      local_c8.size = local_e8.size;
      if (local_e8.d != (Data *)0x0) {
        LOCK();
        ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar10.ucs = (char16_t)&local_c8;
      cVar8 = QString::startsWith(QVar10,(uint)const_t<cfgfile::qstring_trait_t>::c_quotes);
      if (cVar8 != '\0') {
        cVar8 = QString::endsWith(QVar10,(uint)const_t<cfgfile::qstring_trait_t>::c_quotes);
        if (cVar8 != '\0') {
          QString::mid((longlong)&local_a8,(longlong)&local_c8);
          qVar4 = local_c8.size;
          pcVar3 = local_c8.ptr;
          pDVar2 = local_c8.d;
          local_c8.d = local_a8.d;
          local_c8.ptr = local_a8.ptr;
          local_a8.d = pDVar2;
          local_a8.ptr = pcVar3;
          local_c8.size = local_a8.size;
          local_a8.size = qVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        }
      }
      QString::QString((QString *)&local_48,"a");
      QString::number((ulong)&local_60,iVar9);
      ::operator+((QString *)&local_a8,(QString *)&local_48,(QString *)&local_60);
      QDomElement::setAttribute((QString *)&this_element,(QString *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      iVar9 = iVar9 + 1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    }
    iVar9 = (*(local_88->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(local_88);
    pQVar6 = local_80;
    if (*(long *)CONCAT44(extraout_var,iVar9) != ((long *)CONCAT44(extraout_var,iVar9))[1]) {
      iVar9 = (*(ptVar5->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(ptVar5);
      puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar9))[1];
      for (puVar12 = *(undefined8 **)CONCAT44(extraout_var_00,iVar9); puVar12 != puVar1;
          puVar12 = puVar12 + 1) {
        (**(code **)(*(long *)*puVar12 + 0x20))((long *)*puVar12,pQVar6,&this_element);
      }
    }
    QDomNode::~QDomNode((QDomNode *)&this_element);
  }
  return;
}

Assistant:

void print( QDomDocument & doc, QDomElement * parent = 0 ) const override
	{
		if( this->is_defined() )
		{
			QDomElement this_element = doc.createElement( this->name() );

			if( !parent )
				doc.appendChild( this_element );
			else
				parent->appendChild( this_element );

			typename values_vector_t::size_type i = 1;

			for( const T & v : m_values )
			{
				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				QString tmp = value;

				if( tmp.startsWith( const_t< Trait >::c_quotes ) &&
					tmp.endsWith( const_t< Trait >::c_quotes ) )
						tmp = tmp.mid( 1, tmp.length() - 2 );

				this_element.setAttribute( QString( "a" ) + QString::number( i ),
					tmp );

				++i;
			}

			if( !this->children().empty() )
			{
				for( const tag_t< Trait > * tag : this->children() )
					tag->print( doc, &this_element );
			}
		}
	}